

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

int testMultiFunctionTopLevelFeatureDescriptionsMustBeEmpty(void)

{
  FunctionDescription *pFVar1;
  bool bVar2;
  ResultType RVar3;
  ArenaStringPtr *pAVar4;
  Arena *pAVar5;
  FeatureDescription *pFVar6;
  ostream *poVar7;
  Result local_2f8;
  Result local_2d0;
  Result local_2a8;
  Result local_280;
  Result local_258;
  Result local_230;
  Result local_208;
  Result local_1e0;
  Result local_1b8;
  Result local_190;
  Result local_168;
  Result local_140;
  undefined4 local_114;
  Result local_110;
  FunctionDescription *local_e8;
  FunctionDescription *function;
  ModelDescription *description;
  ValidationPolicy local_c4;
  undefined1 local_c0 [4];
  ValidationPolicy validationPolicy;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)local_c0);
  CoreML::ValidationPolicy::ValidationPolicy(&local_c4);
  local_c4.allowsEmptyInput = true;
  local_c4.allowsEmptyOutput = true;
  local_c4.allowsMultipleFunctions = true;
  function = (FunctionDescription *)
             CoreML::Specification::Model::mutable_description((Model *)local_c0);
  pAVar4 = &((ModelDescription *)function)->defaultfunctionname_;
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation((MessageLite *)function);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar4,"foo",pAVar5);
  local_e8 = CoreML::Specification::ModelDescription::add_functions((ModelDescription *)function);
  pAVar4 = &local_e8->name_;
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&local_e8->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar4,"foo",pAVar5);
  CoreML::validateModelDescription(&local_110,(ModelDescription *)function,9,&local_c4);
  bVar2 = CoreML::Result::good(&local_110);
  CoreML::Result::~Result(&local_110);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pFVar6 = CoreML::Specification::ModelDescription::add_input((ModelDescription *)function);
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar6->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar6->name_,"x",pAVar5);
    CoreML::validateModelDescription(&local_140,(ModelDescription *)function,9,&local_c4);
    bVar2 = CoreML::Result::good(&local_140);
    CoreML::Result::~Result(&local_140);
    if (bVar2) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x14c);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,
                               "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                              );
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      CoreML::validateModelDescription(&local_168,(ModelDescription *)function,9,&local_c4);
      RVar3 = CoreML::Result::type(&local_168);
      CoreML::Result::~Result(&local_168);
      if (RVar3 == INVALID_MODEL_INTERFACE) {
        CoreML::Specification::ModelDescription::clear_input((ModelDescription *)function);
        pFVar6 = CoreML::Specification::ModelDescription::add_output((ModelDescription *)function);
        pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar6->super_MessageLite);
        google::protobuf::internal::ArenaStringPtr::
        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar6->name_,"y",pAVar5);
        CoreML::validateModelDescription(&local_190,(ModelDescription *)function,9,&local_c4);
        bVar2 = CoreML::Result::good(&local_190);
        CoreML::Result::~Result(&local_190);
        if (bVar2) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x150);
          poVar7 = std::operator<<(poVar7,": error: ");
          poVar7 = std::operator<<(poVar7,
                                   "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                                  );
          poVar7 = std::operator<<(poVar7," was false, expected true.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
        }
        else {
          CoreML::validateModelDescription(&local_1b8,(ModelDescription *)function,9,&local_c4);
          RVar3 = CoreML::Result::type(&local_1b8);
          CoreML::Result::~Result(&local_1b8);
          if (RVar3 == INVALID_MODEL_INTERFACE) {
            CoreML::Specification::ModelDescription::clear_output((ModelDescription *)function);
            pFVar6 = CoreML::Specification::ModelDescription::add_traininginput
                               ((ModelDescription *)function);
            pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation
                               (&pFVar6->super_MessageLite);
            google::protobuf::internal::ArenaStringPtr::
            Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar6->name_,"z",pAVar5)
            ;
            CoreML::validateModelDescription(&local_1e0,(ModelDescription *)function,9,&local_c4);
            bVar2 = CoreML::Result::good(&local_1e0);
            CoreML::Result::~Result(&local_1e0);
            if (bVar2) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                      );
              poVar7 = std::operator<<(poVar7,":");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x154);
              poVar7 = std::operator<<(poVar7,": error: ");
              poVar7 = std::operator<<(poVar7,
                                       "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                                      );
              poVar7 = std::operator<<(poVar7," was false, expected true.");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              m._oneof_case_[0] = 1;
            }
            else {
              CoreML::validateModelDescription(&local_208,(ModelDescription *)function,9,&local_c4);
              RVar3 = CoreML::Result::type(&local_208);
              CoreML::Result::~Result(&local_208);
              if (RVar3 == INVALID_MODEL_INTERFACE) {
                CoreML::Specification::ModelDescription::clear_traininginput
                          ((ModelDescription *)function);
                pFVar6 = CoreML::Specification::ModelDescription::add_state
                                   ((ModelDescription *)function);
                pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation
                                   (&pFVar6->super_MessageLite);
                google::protobuf::internal::ArenaStringPtr::
                Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                          (&pFVar6->name_,"s",pAVar5);
                CoreML::validateModelDescription
                          (&local_230,(ModelDescription *)function,9,&local_c4);
                bVar2 = CoreML::Result::good(&local_230);
                CoreML::Result::~Result(&local_230);
                if (bVar2) {
                  poVar7 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                          );
                  poVar7 = std::operator<<(poVar7,":");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x158);
                  poVar7 = std::operator<<(poVar7,": error: ");
                  poVar7 = std::operator<<(poVar7,
                                           "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                                          );
                  poVar7 = std::operator<<(poVar7," was false, expected true.");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  m._oneof_case_[0] = 1;
                }
                else {
                  CoreML::validateModelDescription
                            (&local_258,(ModelDescription *)function,9,&local_c4);
                  RVar3 = CoreML::Result::type(&local_258);
                  CoreML::Result::~Result(&local_258);
                  if (RVar3 == INVALID_MODEL_INTERFACE) {
                    CoreML::Specification::ModelDescription::clear_state
                              ((ModelDescription *)function);
                    pFVar1 = function + 1;
                    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation
                                       (&function->super_MessageLite);
                    google::protobuf::internal::ArenaStringPtr::
                    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                              ((ArenaStringPtr *)&pFVar1->input_,"f",pAVar5);
                    CoreML::validateModelDescription
                              (&local_280,(ModelDescription *)function,9,&local_c4);
                    bVar2 = CoreML::Result::good(&local_280);
                    CoreML::Result::~Result(&local_280);
                    if (bVar2) {
                      poVar7 = std::operator<<((ostream *)&std::cout,
                                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                              );
                      poVar7 = std::operator<<(poVar7,":");
                      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x15c);
                      poVar7 = std::operator<<(poVar7,": error: ");
                      poVar7 = std::operator<<(poVar7,
                                               "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                                              );
                      poVar7 = std::operator<<(poVar7," was false, expected true.");
                      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                      m._oneof_case_[0] = 1;
                    }
                    else {
                      CoreML::validateModelDescription
                                (&local_2a8,(ModelDescription *)function,9,&local_c4);
                      RVar3 = CoreML::Result::type(&local_2a8);
                      CoreML::Result::~Result(&local_2a8);
                      if (RVar3 == INVALID_MODEL_INTERFACE) {
                        CoreML::Specification::ModelDescription::clear_predictedfeaturename
                                  ((ModelDescription *)function);
                        pFVar1 = function + 1;
                        pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation
                                           (&function->super_MessageLite);
                        google::protobuf::internal::ArenaStringPtr::
                        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                                  ((ArenaStringPtr *)
                                   &(pFVar1->input_).super_RepeatedPtrFieldBase.current_size_,"f",
                                   pAVar5);
                        CoreML::validateModelDescription
                                  (&local_2d0,(ModelDescription *)function,9,&local_c4);
                        bVar2 = CoreML::Result::good(&local_2d0);
                        CoreML::Result::~Result(&local_2d0);
                        if (bVar2) {
                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                                  );
                          poVar7 = std::operator<<(poVar7,":");
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x160);
                          poVar7 = std::operator<<(poVar7,": error: ");
                          poVar7 = std::operator<<(poVar7,
                                                  "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                                                  );
                          poVar7 = std::operator<<(poVar7," was false, expected true.");
                          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                          m._oneof_case_[0] = 1;
                        }
                        else {
                          CoreML::validateModelDescription
                                    (&local_2f8,(ModelDescription *)function,9,&local_c4);
                          RVar3 = CoreML::Result::type(&local_2f8);
                          CoreML::Result::~Result(&local_2f8);
                          if (RVar3 == INVALID_MODEL_INTERFACE) {
                            CoreML::Specification::ModelDescription::
                            clear_predictedprobabilitiesname((ModelDescription *)function);
                            m._oneof_case_[0] = 0;
                          }
                          else {
                            poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                                  );
                            poVar7 = std::operator<<(poVar7,":");
                            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x160);
                            poVar7 = std::operator<<(poVar7,": error: ");
                            poVar7 = std::operator<<(poVar7,
                                                  "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                                  );
                            poVar7 = std::operator<<(poVar7," was false, expected true.");
                            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                            m._oneof_case_[0] = 1;
                          }
                        }
                      }
                      else {
                        poVar7 = std::operator<<((ostream *)&std::cout,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                                );
                        poVar7 = std::operator<<(poVar7,":");
                        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x15c);
                        poVar7 = std::operator<<(poVar7,": error: ");
                        poVar7 = std::operator<<(poVar7,
                                                 "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                                );
                        poVar7 = std::operator<<(poVar7," was false, expected true.");
                        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                        m._oneof_case_[0] = 1;
                      }
                    }
                  }
                  else {
                    poVar7 = std::operator<<((ostream *)&std::cout,
                                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                            );
                    poVar7 = std::operator<<(poVar7,":");
                    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x158);
                    poVar7 = std::operator<<(poVar7,": error: ");
                    poVar7 = std::operator<<(poVar7,
                                             "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                            );
                    poVar7 = std::operator<<(poVar7," was false, expected true.");
                    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                    m._oneof_case_[0] = 1;
                  }
                }
              }
              else {
                poVar7 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                        );
                poVar7 = std::operator<<(poVar7,":");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x154);
                poVar7 = std::operator<<(poVar7,": error: ");
                poVar7 = std::operator<<(poVar7,
                                         "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                        );
                poVar7 = std::operator<<(poVar7," was false, expected true.");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                m._oneof_case_[0] = 1;
              }
            }
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                    );
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x150);
            poVar7 = std::operator<<(poVar7,": error: ");
            poVar7 = std::operator<<(poVar7,
                                     "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                    );
            poVar7 = std::operator<<(poVar7," was false, expected true.");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            m._oneof_case_[0] = 1;
          }
        }
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x14c);
        poVar7 = std::operator<<(poVar7,": error: ");
        poVar7 = std::operator<<(poVar7,
                                 "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                );
        poVar7 = std::operator<<(poVar7," was false, expected true.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x149);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,
                             "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
                            );
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  local_114 = 1;
  CoreML::Specification::Model::~Model((Model *)local_c0);
  return m._oneof_case_[0];
}

Assistant:

int testMultiFunctionTopLevelFeatureDescriptionsMustBeEmpty() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    auto *function = description->add_functions();
    function->set_name("foo");

    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    description->add_input()->set_name("x");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_input();

    description->add_output()->set_name("y");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_output();

    description->add_traininginput()->set_name("z");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_traininginput();

    description->add_state()->set_name("s");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_state();

    description->set_predictedfeaturename("f");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_predictedfeaturename();

    description->set_predictedprobabilitiesname("f");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_predictedprobabilitiesname();

    return 0;
}